

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateFunctionDefinition(ExpressionTranslateContext *ctx,ExprFunctionDefinition *expression)

{
  FunctionData *function_00;
  VariableData *variable_00;
  bool bVar1;
  uint uVar2;
  VariableData **ppVVar3;
  TypeClass *pTVar4;
  ExprVariableDefinition *local_78;
  ExprVariableDefinition *curr_2;
  ExprBase *value;
  uint i;
  TypeClass *typeClass_1;
  TypeClass *typeClass;
  ExprVariableDefinition *curr_1;
  bool isArgument;
  VariableData *variable;
  ExprVariableDefinition *pEStack_30;
  uint k;
  ExprVariableDefinition *curr;
  bool isGeneric;
  bool isStatic;
  FunctionData *function;
  ExprFunctionDefinition *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  if ((ctx->skipFunctionDefinitions & 1U) == 0) {
    ctx->skipFunctionDefinitions = true;
    function_00 = expression->function;
    bVar1 = false;
    curr._6_1_ = false;
    if (((function_00->scope == ctx->ctx->globalScope) ||
        (function_00->scope->ownerNamespace != (NamespaceData *)0x0)) ||
       (function_00->scope->ownerType != (TypeBase *)0x0)) {
      if (*(function_00->name->name).begin == '$') {
        bVar1 = true;
      }
      else if ((function_00->isHidden & 1U) == 0) {
        curr._6_1_ = ExpressionContext::IsGenericInstance(ctx->ctx,function_00);
      }
      else {
        bVar1 = true;
      }
    }
    else {
      bVar1 = true;
    }
    if (bVar1) {
      Print(ctx,"static ");
    }
    else if (curr._6_1_ != false) {
      Print(ctx,"template<int I> ");
    }
    TranslateTypeName(ctx,function_00->type->returnType);
    Print(ctx," ");
    TranslateFunctionName(ctx,function_00);
    Print(ctx,"(");
    for (pEStack_30 = (expression->arguments).head; pEStack_30 != (ExprVariableDefinition *)0x0;
        pEStack_30 = getType<ExprVariableDefinition>((pEStack_30->super_ExprBase).next)) {
      TranslateTypeName(ctx,pEStack_30->variable->variable->type);
      Print(ctx," ");
      TranslateVariableName(ctx,pEStack_30->variable->variable);
      Print(ctx,", ");
    }
    TranslateTypeName(ctx,expression->contextArgument->variable->variable->type);
    Print(ctx," ");
    TranslateVariableName(ctx,expression->contextArgument->variable->variable);
    Print(ctx,")");
    PrintLine(ctx);
    PrintIndentedLine(ctx,"{");
    ctx->depth = ctx->depth + 1;
    for (variable._4_4_ = 0;
        uVar2 = SmallArray<VariableData_*,_4U>::size(&function_00->functionScope->allVariables),
        variable._4_4_ < uVar2; variable._4_4_ = variable._4_4_ + 1) {
      ppVVar3 = SmallArray<VariableData_*,_4U>::operator[]
                          (&function_00->functionScope->allVariables,variable._4_4_);
      variable_00 = *ppVVar3;
      if (((variable_00->isVmAlloca & 1U) == 0) && ((variable_00->lookupOnly & 1U) == 0)) {
        bVar1 = false;
        for (typeClass = (TypeClass *)(expression->arguments).head; typeClass != (TypeClass *)0x0;
            typeClass = (TypeClass *)
                        getType<ExprVariableDefinition>
                                  ((ExprBase *)
                                   (typeClass->super_TypeStruct).super_TypeBase.importModule)) {
          if (variable_00 ==
              *(VariableData **)((typeClass->super_TypeStruct).super_TypeBase.size + 8)) {
            bVar1 = true;
            break;
          }
        }
        if (((!bVar1) && (variable_00 != expression->contextArgument->variable->variable)) &&
           (variable_00->type != ctx->ctx->typeVoid)) {
          PrintIndent(ctx);
          pTVar4 = getType<TypeClass>(variable_00->type);
          if (pTVar4 == (TypeClass *)0x0) {
            if (variable_00->type->alignment != variable_00->alignment) {
              Print(ctx,"NULLC_ALIGN_MSVC(%d) ",(ulong)variable_00->alignment);
            }
          }
          else {
            uVar2 = GetNaturalClassAlignment(pTVar4);
            if (uVar2 != variable_00->alignment) {
              Print(ctx,"NULLC_ALIGN_MSVC(%d) ",(ulong)variable_00->alignment);
            }
          }
          TranslateTypeName(ctx,variable_00->type);
          pTVar4 = getType<TypeClass>(variable_00->type);
          if (pTVar4 == (TypeClass *)0x0) {
            if (variable_00->type->alignment != variable_00->alignment) {
              Print(ctx," NULLC_ALIGN_GCC(%d)",(ulong)variable_00->alignment);
            }
          }
          else {
            uVar2 = GetNaturalClassAlignment(pTVar4);
            if (uVar2 != variable_00->alignment) {
              Print(ctx," NULLC_ALIGN_GCC(%d)",(ulong)variable_00->alignment);
            }
          }
          Print(ctx," ");
          TranslateVariableName(ctx,variable_00);
          Print(ctx,";");
          PrintLine(ctx);
        }
      }
    }
    if (function_00->type->returnType != ctx->ctx->typeVoid) {
      PrintIndent(ctx);
      TranslateTypeName(ctx,function_00->type->returnType);
      Print(ctx," __nullcReturnValue_%d;",(ulong)ctx->nextReturnValueId);
      PrintLine(ctx);
    }
    if (expression->coroutineStateRead != (ExprBase *)0x0) {
      PrintIndent(ctx);
      Print(ctx,"int __currJmpOffset = ");
      Translate(ctx,expression->coroutineStateRead);
      Print(ctx,";");
      PrintLine(ctx);
      for (value._4_4_ = 0; value._4_4_ < function_00->yieldCount; value._4_4_ = value._4_4_ + 1) {
        PrintIndentedLine(ctx,"if(__currJmpOffset == %d)",(ulong)(value._4_4_ + 1));
        ctx->depth = ctx->depth + 1;
        PrintIndentedLine(ctx,"goto yield_%d;",(ulong)(value._4_4_ + 1));
        ctx->depth = ctx->depth - 1;
      }
    }
    for (curr_2 = (ExprVariableDefinition *)(expression->expressions).head;
        curr_2 != (ExprVariableDefinition *)0x0;
        curr_2 = (ExprVariableDefinition *)(curr_2->super_ExprBase).next) {
      PrintIndent(ctx);
      Translate(ctx,&curr_2->super_ExprBase);
      Print(ctx,";");
      PrintLine(ctx);
    }
    ctx->depth = ctx->depth - 1;
    PrintIndentedLine(ctx,"}");
    ctx->nextReturnValueId = ctx->nextReturnValueId + 1;
    if (curr._6_1_ != false) {
      Print(ctx,"template ");
      TranslateTypeName(ctx,function_00->type->returnType);
      Print(ctx," ");
      TranslateFunctionName(ctx,function_00);
      Print(ctx,"<0>(");
      for (local_78 = (expression->arguments).head; local_78 != (ExprVariableDefinition *)0x0;
          local_78 = getType<ExprVariableDefinition>((local_78->super_ExprBase).next)) {
        TranslateTypeName(ctx,local_78->variable->variable->type);
        Print(ctx," ");
        TranslateVariableName(ctx,local_78->variable->variable);
        Print(ctx,", ");
      }
      TranslateTypeName(ctx,expression->contextArgument->variable->variable->type);
      Print(ctx," ");
      TranslateVariableName(ctx,expression->contextArgument->variable->variable);
      Print(ctx,");");
      PrintLine(ctx);
    }
    ctx->skipFunctionDefinitions = false;
  }
  else {
    Print(ctx,"(");
    TranslateTypeName(ctx,(expression->super_ExprBase).type);
    Print(ctx,")");
    Print(ctx,"__nullcMakeFunction(__nullcFR[%d], 0)",(ulong)expression->function->functionIndex);
  }
  return;
}

Assistant:

void TranslateFunctionDefinition(ExpressionTranslateContext &ctx, ExprFunctionDefinition *expression)
{
	if(!ctx.skipFunctionDefinitions)
	{
		// Skip nested definitions
		ctx.skipFunctionDefinitions = true;

		FunctionData *function = expression->function;

		bool isStatic = false;
		bool isGeneric = false;

		if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
			isStatic = true;
		else if(*function->name->name.begin == '$')
			isStatic = true;
		else if(function->isHidden)
			isStatic = true;
		else if(ctx.ctx.IsGenericInstance(function))
			isGeneric = true;

		if(isStatic)
			Print(ctx, "static ");
		else if(isGeneric)
			Print(ctx, "template<int I> ");

		TranslateTypeName(ctx, function->type->returnType);
		Print(ctx, " ");
		TranslateFunctionName(ctx, function);
		Print(ctx, "(");

		for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
		{
			TranslateTypeName(ctx, curr->variable->variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, curr->variable->variable);
			Print(ctx, ", ");
		}

		TranslateTypeName(ctx, expression->contextArgument->variable->variable->type);
		Print(ctx, " ");
		TranslateVariableName(ctx, expression->contextArgument->variable->variable);

		Print(ctx, ")");
		PrintLine(ctx);
		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		for(unsigned k = 0; k < function->functionScope->allVariables.size(); k++)
		{
			VariableData *variable = function->functionScope->allVariables[k];

			// Don't need variables allocated by intermediate vm compilation
			if(variable->isVmAlloca)
				continue;

			if(variable->lookupOnly)
				continue;

			bool isArgument = false;

			for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
			{
				if(variable == curr->variable->variable)
				{
					isArgument = true;
					break;
				}
			}

			if(isArgument || variable == expression->contextArgument->variable->variable)
				continue;

			if(variable->type == ctx.ctx.typeVoid)
				continue;

			PrintIndent(ctx);

			if(TypeClass *typeClass = getType<TypeClass>(variable->type))
			{
				if(GetNaturalClassAlignment(typeClass) != variable->alignment)
					Print(ctx, "NULLC_ALIGN_MSVC(%d) ", variable->alignment);
			}
			else if(variable->type->alignment != variable->alignment)
			{
				Print(ctx, "NULLC_ALIGN_MSVC(%d) ", variable->alignment);
			}

			TranslateTypeName(ctx, variable->type);

			if(TypeClass *typeClass = getType<TypeClass>(variable->type))
			{
				if(GetNaturalClassAlignment(typeClass) != variable->alignment)
					Print(ctx, " NULLC_ALIGN_GCC(%d)", variable->alignment);
			}
			else if(variable->type->alignment != variable->alignment)
			{
				Print(ctx, " NULLC_ALIGN_GCC(%d)", variable->alignment);
			}

			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}

		if(function->type->returnType != ctx.ctx.typeVoid)
		{
			PrintIndent(ctx);
			TranslateTypeName(ctx, function->type->returnType);
			Print(ctx, " __nullcReturnValue_%d;", ctx.nextReturnValueId);
			PrintLine(ctx);
		}

		if(expression->coroutineStateRead)
		{
			PrintIndent(ctx);
			Print(ctx, "int __currJmpOffset = ");
			Translate(ctx, expression->coroutineStateRead);
			Print(ctx, ";");
			PrintLine(ctx);

			for(unsigned i = 0; i < function->yieldCount; i++)
			{
				PrintIndentedLine(ctx, "if(__currJmpOffset == %d)", i + 1);

				ctx.depth++;

				PrintIndentedLine(ctx, "goto yield_%d;", i + 1);

				ctx.depth--;
			}
		}

		for(ExprBase *value = expression->expressions.head; value; value = value->next)
		{
			PrintIndent(ctx);

			Translate(ctx, value);

			Print(ctx, ";");

			PrintLine(ctx);
		}


		ctx.depth--;

		PrintIndentedLine(ctx, "}");

		ctx.nextReturnValueId++;

		if(isGeneric)
		{
			Print(ctx, "template ");

			TranslateTypeName(ctx, function->type->returnType);
			Print(ctx, " ");
			TranslateFunctionName(ctx, function);
			Print(ctx, "<0>(");

			for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
			{
				TranslateTypeName(ctx, curr->variable->variable->type);
				Print(ctx, " ");
				TranslateVariableName(ctx, curr->variable->variable);
				Print(ctx, ", ");
			}

			TranslateTypeName(ctx, expression->contextArgument->variable->variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, expression->contextArgument->variable->variable);

			Print(ctx, ");");
			PrintLine(ctx);
		}

		ctx.skipFunctionDefinitions = false;
	}
	else
	{
		Print(ctx, "(");
		TranslateTypeName(ctx, expression->type);
		Print(ctx, ")");
		Print(ctx, "__nullcMakeFunction(__nullcFR[%d], 0)", expression->function->functionIndex);
	}
}